

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O0

result * optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  objective_function_type *this;
  int variable_index_to_affect;
  undefined8 __args;
  bool bVar1;
  pointer pnVar2;
  pointer pnVar3;
  const_reference arg1;
  __tuple_element_t<0UL,_tuple<problem,_problem>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<problem,_problem>_> *p_Var5;
  reference pvVar6;
  double *arg1_00;
  int *piVar7;
  size_type sVar8;
  size_type sVar9;
  int *args;
  double local_640;
  double local_620;
  double local_5e8;
  unsigned_long local_5b8;
  size_type local_5b0;
  unsigned_long local_5a8;
  size_type local_5a0;
  reference local_598;
  node *elem;
  iterator __end2;
  iterator __begin2;
  problem_set *__range2;
  double local_560;
  undefined1 local_558 [8];
  result ret1;
  double local_4a8;
  undefined1 local_4a0 [8];
  result ret0;
  tuple<baryonyx::problem,_baryonyx::problem> sp;
  iterator it;
  int annoying_variable;
  double local_1f0;
  undefined1 local_1e8 [8];
  problem_set jobs;
  undefined1 local_1a0 [8];
  context internal_ctx;
  problem *pb_local;
  context *ctx_local;
  result *best;
  
  internal_ctx._376_8_ = pb;
  baryonyx::context::context((context *)local_1a0,ctx);
  internal_ctx.finish._M_invoker._0_4_ = 4;
  baryonyx::itm::optimize
            (__return_storage_ptr__,(context *)local_1a0,(problem *)internal_ctx._376_8_);
  bVar1 = baryonyx::result::operator_cast_to_bool(__return_storage_ptr__);
  if (bVar1) {
    pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::front
                       (&__return_storage_ptr__->solutions);
    baryonyx::notice<double>
              ((context *)local_1a0,"  - branch optimization found solution {:f}\n",&pvVar6->value);
  }
  std::multiset<node,_node_result_compare,_std::allocator<node>_>::multiset
            ((multiset<node,_node_result_compare,_std::allocator<node>_> *)local_1e8);
  __args = internal_ctx._376_8_;
  bVar1 = baryonyx::result::operator_cast_to_bool(__return_storage_ptr__);
  if (bVar1) {
    pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                       (&__return_storage_ptr__->solutions);
    local_5e8 = pvVar6->value;
  }
  else {
    local_5e8 = 0.0;
  }
  local_1f0 = local_5e8;
  std::multiset<node,node_result_compare,std::allocator<node>>::
  emplace<baryonyx::problem_const&,double,int&,int&>
            ((multiset<node,node_result_compare,std::allocator<node>> *)local_1e8,(problem *)__args,
             &local_1f0,&__return_storage_ptr__->remaining_constraints,
             &__return_storage_ptr__->annoying_variable);
  variable_index_to_affect = __return_storage_ptr__->annoying_variable;
  do {
    sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
    super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl._240_8_ =
         std::multiset<node,_node_result_compare,_std::allocator<node>_>::begin
                   ((multiset<node,_node_result_compare,_std::allocator<node>_> *)local_1e8);
    this = &sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
            super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl.type;
    pnVar2 = std::_Rb_tree_const_iterator<node>::operator->((_Rb_tree_const_iterator<node> *)this);
    pnVar3 = std::_Rb_tree_const_iterator<node>::operator->((_Rb_tree_const_iterator<node> *)this);
    arg1 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::operator[](&(pnVar2->problem).vars.names,(long)pnVar3->annoying_variable);
    pnVar2 = std::_Rb_tree_const_iterator<node>::operator->((_Rb_tree_const_iterator<node> *)this);
    baryonyx::notice<std::basic_string_view<char,std::char_traits<char>>,int>
              ((context *)local_1a0,"  - branch-optimization splits on {} (id: {})\n",arg1,
               &pnVar2->annoying_variable);
    pnVar2 = std::_Rb_tree_const_iterator<node>::operator->
                       ((_Rb_tree_const_iterator<node> *)
                        &sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
                         super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl.type);
    baryonyx::split((tuple<baryonyx::problem,_baryonyx::problem> *)&ret0.status,(context *)local_1a0
                    ,&pnVar2->problem,variable_index_to_affect);
    p_Var4 = std::get<0ul,baryonyx::problem,baryonyx::problem>
                       ((tuple<baryonyx::problem,_baryonyx::problem> *)&ret0.status);
    baryonyx::itm::optimize((result *)local_4a0,(context *)local_1a0,p_Var4);
    pnVar2 = std::_Rb_tree_const_iterator<node>::operator->
                       ((_Rb_tree_const_iterator<node> *)
                        &sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
                         super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl.type);
    bVar1 = is_best((context *)local_1a0,(result *)local_4a0,__return_storage_ptr__,
                    (pnVar2->problem).type);
    if (bVar1) {
      baryonyx::result::operator=(__return_storage_ptr__,(result *)local_4a0);
    }
    p_Var4 = std::get<0ul,baryonyx::problem,baryonyx::problem>
                       ((tuple<baryonyx::problem,_baryonyx::problem> *)&ret0.status);
    bVar1 = baryonyx::result::operator_cast_to_bool((result *)local_4a0);
    if (bVar1) {
      pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                         ((vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                          &ret0.variable_name.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_620 = pvVar6->value;
    }
    else {
      local_620 = 0.0;
    }
    local_4a8 = local_620;
    ret1._160_8_ = std::multiset<node,node_result_compare,std::allocator<node>>::
                   emplace<baryonyx::problem&,double,int&,int&>
                             ((multiset<node,node_result_compare,std::allocator<node>> *)local_1e8,
                              p_Var4,&local_4a8,&ret0.variables,&ret0.constraints);
    p_Var5 = std::get<1ul,baryonyx::problem,baryonyx::problem>
                       ((tuple<baryonyx::problem,_baryonyx::problem> *)&ret0.status);
    baryonyx::itm::optimize((result *)local_558,(context *)local_1a0,p_Var5);
    pnVar2 = std::_Rb_tree_const_iterator<node>::operator->
                       ((_Rb_tree_const_iterator<node> *)
                        &sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
                         super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl.type);
    bVar1 = is_best((context *)local_1a0,(result *)local_558,__return_storage_ptr__,
                    (pnVar2->problem).type);
    if (bVar1) {
      baryonyx::result::operator=(__return_storage_ptr__,(result *)local_558);
    }
    p_Var5 = std::get<1ul,baryonyx::problem,baryonyx::problem>
                       ((tuple<baryonyx::problem,_baryonyx::problem> *)&ret0.status);
    bVar1 = baryonyx::result::operator_cast_to_bool((result *)local_558);
    if (bVar1) {
      pvVar6 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                         ((vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *)
                          &ret1.variable_name.
                           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_640 = pvVar6->value;
    }
    else {
      local_640 = 0.0;
    }
    local_560 = local_640;
    std::multiset<node,node_result_compare,std::allocator<node>>::
    emplace<baryonyx::problem&,double,int&,int&>
              ((multiset<node,node_result_compare,std::allocator<node>> *)local_1e8,p_Var5,
               &local_560,&ret1.variables,&ret1.constraints);
    std::multiset<node,node_result_compare,std::allocator<node>>::erase_abi_cxx11_
              ((multiset<node,node_result_compare,std::allocator<node>> *)local_1e8,
               (const_iterator)
               sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
               super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl._240_8_);
    baryonyx::notice<>((context *)local_1a0,"    Jobs lists:\n");
    __end2 = std::multiset<node,_node_result_compare,_std::allocator<node>_>::begin
                       ((multiset<node,_node_result_compare,_std::allocator<node>_> *)local_1e8);
    elem = (node *)std::multiset<node,_node_result_compare,_std::allocator<node>_>::end
                             ((multiset<node,_node_result_compare,_std::allocator<node>_> *)
                              local_1e8);
    while (bVar1 = std::operator==(&__end2,(_Self *)&elem), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_598 = std::_Rb_tree_const_iterator<node>::operator*(&__end2);
      if (local_598->remaining_constraints == 0) {
        arg1_00 = &local_598->solution;
        piVar7 = &local_598->annoying_variable;
        local_5a0 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                              (&(local_598->problem).affected_vars.values);
        sVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                          (&(local_598->problem).affected_vars.values);
        sVar9 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
                size(&(local_598->problem).vars.values);
        local_5a8 = sVar8 + sVar9;
        baryonyx::notice<double,int,unsigned_long,unsigned_long>
                  ((context *)local_1a0,"    * solution: {} annoying: {} vars: {}/{}\n",arg1_00,
                   piVar7,&local_5a0,&local_5a8);
      }
      else {
        piVar7 = &local_598->remaining_constraints;
        args = &local_598->annoying_variable;
        local_5b0 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                              (&(local_598->problem).affected_vars.values);
        sVar8 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                          (&(local_598->problem).affected_vars.values);
        sVar9 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
                size(&(local_598->problem).vars.values);
        local_5b8 = sVar8 + sVar9;
        baryonyx::notice<int,int,unsigned_long,unsigned_long>
                  ((context *)local_1a0,"    * remaining: {} annoying: {} vars: {}/{}\n",piVar7,args
                   ,&local_5b0,&local_5b8);
      }
      std::_Rb_tree_const_iterator<node>::operator++(&__end2);
    }
    baryonyx::result::~result((result *)local_558);
    baryonyx::result::~result((result *)local_4a0);
    std::tuple<baryonyx::problem,_baryonyx::problem>::~tuple
              ((tuple<baryonyx::problem,_baryonyx::problem> *)&ret0.status);
    bVar1 = std::multiset<node,_node_result_compare,_std::allocator<node>_>::empty
                      ((multiset<node,_node_result_compare,_std::allocator<node>_> *)local_1e8);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  std::multiset<node,_node_result_compare,_std::allocator<node>_>::~multiset
            ((multiset<node,_node_result_compare,_std::allocator<node>_> *)local_1e8);
  baryonyx::context::~context((context *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static baryonyx::result
optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    manual_course array(ctx.parameters.theta,
                        ctx.parameters.delta,
                        ctx.parameters.kappa_min,
                        ctx.parameters.kappa_step,
                        ctx.parameters.init_policy_random,
                        5);

    baryonyx::context internal(ctx);
    internal.log_priority = baryonyx::context::message_type::warning;

    auto best_params = std::make_unique<int[]>(array.length);
    double best = +HUGE_VAL;

    do {
        internal.parameters.theta = array.theta[array.iterators[0]];
        internal.parameters.delta = array.delta[array.iterators[1]];
        internal.parameters.kappa_min = array.kappa_min[array.iterators[2]];
        internal.parameters.kappa_step = array.kappa_step[array.iterators[3]];
        internal.parameters.init_policy_random =
          array.init_policy_random[array.iterators[4]];

        baryonyx::notice(internal,
                         "  - optimization with theta:{} delta:{} "
                         "kappa-min:{} kappa-step:{} "
                         "init-policy-random: {}",
                         internal.parameters.theta,
                         internal.parameters.delta,
                         internal.parameters.kappa_min,
                         internal.parameters.kappa_step,
                         internal.parameters.init_policy_random);

        auto ret = baryonyx::itm::optimize(internal, pb);
        if (ret) {
            baryonyx::notice(internal, "{:f}\n", ret.solutions.back().value);
            if (best > ret.solutions.back().value) {
                best = ret.solutions.back().value;

                std::copy_n(
                  array.iterators.get(), array.length, best_params.get());
            }
        } else {
            baryonyx::notice(internal, "no solution\n");
        }
    } while (array.next());

    baryonyx::notice(
      internal,
      "  - manual optimization found solution {:f}: with theta:{} "
      "delta:{} kappa-min:{} kappa-step:{} init-random:{}\n",
      best,
      array.theta[array.iterators[0]],
      array.delta[array.iterators[1]],
      array.kappa_min[array.iterators[2]],
      array.kappa_step[array.iterators[3]],
      array.init_policy_random[array.iterators[4]]);

    return baryonyx::itm::optimize(internal, pb);
}